

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O2

bool __thiscall
r_comp::RepliStruct::parseDirective
          (RepliStruct *this,istream *stream,uint64_t *curIndent,uint64_t *prevIndent)

{
  char cVar1;
  int iVar2;
  long lVar3;
  int64_t iVar4;
  bool bVar5;
  int64_t iStack_a0;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  uint64_t *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&str,"!",(allocator *)&local_78);
  while (lVar3 = *(long *)(*(long *)stream + -0x18), ((byte)stream[lVar3 + 0x20] & 2) == 0) {
    cVar1 = std::istream::peek();
    if (cVar1 < '!') {
      lVar3 = *(long *)(*(long *)stream + -0x18);
      break;
    }
    std::istream::get();
    std::__cxx11::string::push_back((char)&str);
  }
  if (((byte)stream[lVar3 + 0x20] & 2) == 0) {
    iVar2 = std::__cxx11::string::compare((char *)&str);
    iStack_a0 = 2;
    local_58 = curIndent;
    if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&str), iVar2 == 0)) {
LAB_0012d37a:
      bVar5 = false;
LAB_0012d399:
      std::__cxx11::string::_M_assign((string *)&this->cmd);
      if (bVar5) {
        while ((((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0 &&
               (iVar2 = std::istream::peek(), 0xd < iVar2))) {
          std::istream::get();
        }
        while ((bVar5 = true, ((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0 &&
               (iVar2 = std::istream::peek(), iVar2 < 0x20))) {
          iVar2 = std::istream::get();
          if (iVar2 == 10) {
            GlobalLine = GlobalLine + 1;
          }
        }
        goto LAB_0012d47a;
      }
      iVar4 = parse(this,stream,local_58,prevIndent,iStack_a0);
      if (iVar4 == 0) {
        bVar5 = true;
        goto LAB_0012d47a;
      }
      std::operator+(&local_50,"Error parsing the arguments for directive \'",&this->cmd);
      std::operator+(&local_78,&local_50,"\'. ");
      std::__cxx11::string::append((string *)&this->error);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&str);
      if (iVar2 == 0) {
        iStack_a0 = 1;
        goto LAB_0012d37a;
      }
      iVar2 = std::__cxx11::string::compare((char *)&str);
      iStack_a0 = 1;
      if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&str), iVar2 == 0)) {
        bVar5 = false;
LAB_0012d390:
        this->type = Condition;
        goto LAB_0012d399;
      }
      iVar2 = std::__cxx11::string::compare((char *)&str);
      bVar5 = true;
      if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&str), iVar2 == 0)) {
        iStack_a0 = 0;
        goto LAB_0012d390;
      }
      iVar2 = std::__cxx11::string::compare((char *)&str);
      iStack_a0 = 1;
      if ((((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&str), iVar2 == 0)) ||
          (iVar2 = std::__cxx11::string::compare((char *)&str), iVar2 == 0)) ||
         (iVar2 = std::__cxx11::string::compare((char *)&str), iVar2 == 0)) goto LAB_0012d37a;
      std::operator+(&local_50,"Unknown directive: \'",&str);
      std::operator+(&local_78,&local_50,"\'. ");
      std::__cxx11::string::append((string *)&this->error);
    }
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__cxx11::string::append((char *)&this->error);
  }
  bVar5 = false;
LAB_0012d47a:
  std::__cxx11::string::~string((string *)&str);
  return bVar5;
}

Assistant:

bool RepliStruct::parseDirective(std::istream *stream, uint64_t &curIndent, uint64_t &prevIndent)
{
    std::string str = "!";
    // RepliStruct* subStruct;
    char c;

    // We know that parent read a '!', so first find out which directive
    while ((!stream->eof()) && ((c = stream->peek()) > 32)) {
        str += stream->get();
    }

    if (stream->eof()) {
        error += "Error in directive formatting, end of file reached unexpectedly. ";
        return false;
    }

    unsigned int paramCount = 0;

    if (str.compare("!def") == 0) { // () ()
        paramCount = 2;
    } else if (str.compare("!counter") == 0) { // xxx val
        paramCount = 2;
    } else if (str.compare("!undef") == 0) { // xxx
        paramCount = 1;
    } else if (str.compare("!ifdef") == 0) { // name
        this->type = Condition;
        paramCount = 1;
    } else if (str.compare("!ifundef") == 0) { // name
        this->type = Condition;
        paramCount = 1;
    } else if (str.compare("!else") == 0) { //
        this->type = Condition;
        paramCount = 0;
    } else if (str.compare("!endif") == 0) { //
        this->type = Condition;
        paramCount = 0;
    } else if (str.compare("!class") == 0) { // ()
        paramCount = 1;
    } else if (str.compare("!op") == 0) { // ():xxx
        paramCount = 1;
    } else if (str.compare("!dfn") == 0) { // ()
        paramCount = 1;
    } else if (str.compare("!load") == 0) { // xxx
        paramCount = 1;
    } else {
        error += "Unknown directive: '" + str + "'. ";
        return false;
    }

    cmd = str;

    if (paramCount == 0) {
        // read until end of line, including any comments
        while ((!stream->eof()) && (stream->peek() > 13)) {
            stream->get();
        }

        // read the end of line too
        while ((!stream->eof()) && (stream->peek() < 32))
            if (stream->get() == '\n') {
                GlobalLine++;
            }

        return true;
    }

    if (parse(stream, curIndent, prevIndent, paramCount) != 0) {
        error += "Error parsing the arguments for directive '" + cmd + "'. ";
        return false;
    } else {
        return true;
    }
}